

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimp3.h
# Opt level: O2

int L3_read_side_info(bs_t *bs,L3_gr_info_t *gr,uint8_t *hdr)

{
  byte bVar1;
  uint32_t uVar2;
  uint uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint uVar6;
  byte bVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  uint8_t *puVar11;
  int local_64;
  
  bVar1 = hdr[1];
  iVar8 = ((bVar1 >> 3 & 1) + (uint)((bVar1 >> 4 & 1) != 0)) * 3 + (hdr[2] >> 2 & 3);
  iVar8 = iVar8 + -1 + (uint)(iVar8 == 0);
  uVar4 = 0;
  uVar9 = (hdr[3] < 0xc0) + 1;
  if ((bVar1 & 8) == 0) {
    uVar2 = get_bits(bs,uVar9 | 8);
    uVar3 = uVar2 >> (sbyte)uVar9;
    uVar6 = uVar9;
  }
  else {
    uVar6 = uVar9 * 2;
    uVar3 = get_bits(bs,9);
    uVar4 = get_bits(bs,uVar9 * 2 + 7);
  }
  puVar11 = &gr->scfsi;
  local_64 = 0;
  do {
    uVar9 = uVar4 << 4;
    if (hdr[3] < 0xc0) {
      uVar9 = uVar4;
    }
    uVar10 = (ulong)uVar9;
    uVar4 = get_bits(bs,0xc);
    *(uint16_t *)(puVar11 + -0x17) = (uint16_t)uVar4;
    uVar2 = get_bits(bs,9);
    *(uint16_t *)(puVar11 + -0x15) = (uint16_t)uVar2;
    if (0x120 < (uVar2 & 0xffff)) {
      return -1;
    }
    uVar2 = get_bits(bs,8);
    puVar11[-0x11] = (byte)uVar2;
    uVar2 = get_bits(bs,(uint)((hdr[1] & 8) == 0) * 5 + 4);
    *(uint16_t *)(puVar11 + -0x13) = (uint16_t)uVar2;
    ((L3_gr_info_t *)(puVar11 + -0x1f))->sfbtab = L3_read_side_info::g_scf_long[iVar8];
    *(undefined2 *)(puVar11 + -0xe) = 0x16;
    uVar2 = get_bits(bs,1);
    if (uVar2 == 0) {
      *(undefined2 *)(puVar11 + -0x10) = 0;
      uVar2 = get_bits(bs,0xf);
      uVar5 = get_bits(bs,4);
      puVar11[-9] = (byte)uVar5;
      uVar5 = get_bits(bs,3);
      puVar11[-8] = (byte)uVar5;
      puVar11[-7] = 0xff;
    }
    else {
      uVar2 = get_bits(bs,2);
      puVar11[-0x10] = (byte)uVar2;
      if ((byte)uVar2 == 0) {
        return -1;
      }
      uVar2 = get_bits(bs,1);
      puVar11[-0xf] = (byte)uVar2;
      puVar11[-9] = '\a';
      puVar11[-8] = 0xff;
      if (puVar11[-0x10] == 2) {
        if ((byte)uVar2 == 0) {
          puVar11[-9] = 8;
          ((L3_gr_info_t *)(puVar11 + -0x1f))->sfbtab = L3_read_side_info::g_scf_short[iVar8];
          bVar7 = 0x27;
          bVar1 = 0;
        }
        else {
          ((L3_gr_info_t *)(puVar11 + -0x1f))->sfbtab = L3_read_side_info::g_scf_mixed[iVar8];
          bVar1 = ((hdr[1] & 8) >> 2) + 6;
          bVar7 = 0x1e;
        }
        uVar10 = (ulong)(uVar9 & 0xf0f);
        puVar11[-0xe] = bVar1;
        puVar11[-0xd] = bVar7;
      }
      uVar2 = get_bits(bs,10);
      uVar2 = uVar2 << 5;
      uVar5 = get_bits(bs,3);
      puVar11[-6] = (byte)uVar5;
      uVar5 = get_bits(bs,3);
      puVar11[-5] = (byte)uVar5;
      uVar5 = get_bits(bs,3);
      puVar11[-4] = (byte)uVar5;
    }
    puVar11[-0xc] = (byte)(uVar2 >> 10);
    puVar11[-0xb] = (byte)(uVar2 >> 5) & 0x1f;
    puVar11[-10] = (byte)uVar2 & 0x1f;
    if ((hdr[1] & 8) == 0) {
      bVar1 = 499 < *(ushort *)(puVar11 + -0x13);
    }
    else {
      uVar2 = get_bits(bs,1);
      bVar1 = (byte)uVar2;
    }
    local_64 = local_64 + (uVar4 & 0xffff);
    puVar11[-3] = bVar1;
    uVar4 = get_bits(bs,1);
    puVar11[-2] = (byte)uVar4;
    uVar4 = get_bits(bs,1);
    puVar11[-1] = (byte)uVar4;
    *puVar11 = (byte)(uVar10 >> 0xc) & 0xf;
    uVar4 = (int)uVar10 << 4;
    puVar11 = puVar11 + 0x20;
    uVar6 = uVar6 - 1;
  } while (uVar6 != 0);
  uVar9 = 0xffffffff;
  if (local_64 + bs->pos <= (int)(uVar3 * 8 + bs->limit)) {
    uVar9 = uVar3;
  }
  return uVar9;
}

Assistant:

static int L3_read_side_info(bs_t *bs, L3_gr_info_t *gr, const uint8_t *hdr)
{
    static const uint8_t g_scf_long[8][23] = {
        { 6,6,6,6,6,6,8,10,12,14,16,20,24,28,32,38,46,52,60,68,58,54,0 },
        { 12,12,12,12,12,12,16,20,24,28,32,40,48,56,64,76,90,2,2,2,2,2,0 },
        { 6,6,6,6,6,6,8,10,12,14,16,20,24,28,32,38,46,52,60,68,58,54,0 },
        { 6,6,6,6,6,6,8,10,12,14,16,18,22,26,32,38,46,54,62,70,76,36,0 },
        { 6,6,6,6,6,6,8,10,12,14,16,20,24,28,32,38,46,52,60,68,58,54,0 },
        { 4,4,4,4,4,4,6,6,8,8,10,12,16,20,24,28,34,42,50,54,76,158,0 },
        { 4,4,4,4,4,4,6,6,6,8,10,12,16,18,22,28,34,40,46,54,54,192,0 },
        { 4,4,4,4,4,4,6,6,8,10,12,16,20,24,30,38,46,56,68,84,102,26,0 }
    };
    static const uint8_t g_scf_short[8][40] = {
        { 4,4,4,4,4,4,4,4,4,6,6,6,8,8,8,10,10,10,12,12,12,14,14,14,18,18,18,24,24,24,30,30,30,40,40,40,18,18,18,0 },
        { 8,8,8,8,8,8,8,8,8,12,12,12,16,16,16,20,20,20,24,24,24,28,28,28,36,36,36,2,2,2,2,2,2,2,2,2,26,26,26,0 },
        { 4,4,4,4,4,4,4,4,4,6,6,6,6,6,6,8,8,8,10,10,10,14,14,14,18,18,18,26,26,26,32,32,32,42,42,42,18,18,18,0 },
        { 4,4,4,4,4,4,4,4,4,6,6,6,8,8,8,10,10,10,12,12,12,14,14,14,18,18,18,24,24,24,32,32,32,44,44,44,12,12,12,0 },
        { 4,4,4,4,4,4,4,4,4,6,6,6,8,8,8,10,10,10,12,12,12,14,14,14,18,18,18,24,24,24,30,30,30,40,40,40,18,18,18,0 },
        { 4,4,4,4,4,4,4,4,4,4,4,4,6,6,6,8,8,8,10,10,10,12,12,12,14,14,14,18,18,18,22,22,22,30,30,30,56,56,56,0 },
        { 4,4,4,4,4,4,4,4,4,4,4,4,6,6,6,6,6,6,10,10,10,12,12,12,14,14,14,16,16,16,20,20,20,26,26,26,66,66,66,0 },
        { 4,4,4,4,4,4,4,4,4,4,4,4,6,6,6,8,8,8,12,12,12,16,16,16,20,20,20,26,26,26,34,34,34,42,42,42,12,12,12,0 }
    };
    static const uint8_t g_scf_mixed[8][40] = {
        { 6,6,6,6,6,6,6,6,6,8,8,8,10,10,10,12,12,12,14,14,14,18,18,18,24,24,24,30,30,30,40,40,40,18,18,18,0 },
        { 12,12,12,4,4,4,8,8,8,12,12,12,16,16,16,20,20,20,24,24,24,28,28,28,36,36,36,2,2,2,2,2,2,2,2,2,26,26,26,0 },
        { 6,6,6,6,6,6,6,6,6,6,6,6,8,8,8,10,10,10,14,14,14,18,18,18,26,26,26,32,32,32,42,42,42,18,18,18,0 },
        { 6,6,6,6,6,6,6,6,6,8,8,8,10,10,10,12,12,12,14,14,14,18,18,18,24,24,24,32,32,32,44,44,44,12,12,12,0 },
        { 6,6,6,6,6,6,6,6,6,8,8,8,10,10,10,12,12,12,14,14,14,18,18,18,24,24,24,30,30,30,40,40,40,18,18,18,0 },
        { 4,4,4,4,4,4,6,6,4,4,4,6,6,6,8,8,8,10,10,10,12,12,12,14,14,14,18,18,18,22,22,22,30,30,30,56,56,56,0 },
        { 4,4,4,4,4,4,6,6,4,4,4,6,6,6,6,6,6,10,10,10,12,12,12,14,14,14,16,16,16,20,20,20,26,26,26,66,66,66,0 },
        { 4,4,4,4,4,4,6,6,4,4,4,6,6,6,8,8,8,12,12,12,16,16,16,20,20,20,26,26,26,34,34,34,42,42,42,12,12,12,0 }
    };

    unsigned tables, scfsi = 0;
    int main_data_begin, part_23_sum = 0;
    int sr_idx = HDR_GET_MY_SAMPLE_RATE(hdr); sr_idx -= (sr_idx != 0);
    int gr_count = HDR_IS_MONO(hdr) ? 1 : 2;

    if (HDR_TEST_MPEG1(hdr))
    {
        gr_count *= 2;
        main_data_begin = get_bits(bs, 9);
        scfsi = get_bits(bs, 7 + gr_count);
    } else
    {
        main_data_begin = get_bits(bs, 8 + gr_count) >> gr_count;
    }

    do
    {
        if (HDR_IS_MONO(hdr))
        {
            scfsi <<= 4;
        }
        gr->part_23_length = (uint16_t)get_bits(bs, 12);
        part_23_sum += gr->part_23_length;
        gr->big_values = (uint16_t)get_bits(bs,  9);
        if (gr->big_values > 288)
        {
            return -1;
        }
        gr->global_gain = (uint8_t)get_bits(bs, 8);
        gr->scalefac_compress = (uint16_t)get_bits(bs, HDR_TEST_MPEG1(hdr) ? 4 : 9);
        gr->sfbtab = g_scf_long[sr_idx];
        gr->n_long_sfb  = 22;
        gr->n_short_sfb = 0;
        if (get_bits(bs, 1))
        {
            gr->block_type = (uint8_t)get_bits(bs, 2);
            if (!gr->block_type)
            {
                return -1;
            }
            gr->mixed_block_flag = (uint8_t)get_bits(bs, 1);
            gr->region_count[0] = 7;
            gr->region_count[1] = 255;
            if (gr->block_type == SHORT_BLOCK_TYPE)
            {
                scfsi &= 0x0F0F;
                if (!gr->mixed_block_flag)
                {
                    gr->region_count[0] = 8;
                    gr->sfbtab = g_scf_short[sr_idx];
                    gr->n_long_sfb = 0;
                    gr->n_short_sfb = 39;
                } else
                {
                    gr->sfbtab = g_scf_mixed[sr_idx];
                    gr->n_long_sfb = HDR_TEST_MPEG1(hdr) ? 8 : 6;
                    gr->n_short_sfb = 30;
                }
            }
            tables = get_bits(bs, 10);
            tables <<= 5;
            gr->subblock_gain[0] = (uint8_t)get_bits(bs, 3);
            gr->subblock_gain[1] = (uint8_t)get_bits(bs, 3);
            gr->subblock_gain[2] = (uint8_t)get_bits(bs, 3);
        } else
        {
            gr->block_type = 0;
            gr->mixed_block_flag = 0;
            tables = get_bits(bs, 15);
            gr->region_count[0] = (uint8_t)get_bits(bs, 4);
            gr->region_count[1] = (uint8_t)get_bits(bs, 3);
            gr->region_count[2] = 255;
        }
        gr->table_select[0] = (uint8_t)(tables >> 10);
        gr->table_select[1] = (uint8_t)((tables >> 5) & 31);
        gr->table_select[2] = (uint8_t)((tables) & 31);
        gr->preflag = HDR_TEST_MPEG1(hdr) ? get_bits(bs, 1) : (gr->scalefac_compress >= 500);
        gr->scalefac_scale = (uint8_t)get_bits(bs, 1);
        gr->count1_table = (uint8_t)get_bits(bs, 1);
        gr->scfsi = (uint8_t)((scfsi >> 12) & 15);
        scfsi <<= 4;
        gr++;
    } while(--gr_count);

    if (part_23_sum + bs->pos > bs->limit + main_data_begin*8)
    {
        return -1;
    }

    return main_data_begin;
}